

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall cashew::ValueBuilder::makeDot(ValueBuilder *this,Ref obj,IString key)

{
  Value *pVVar1;
  Ref RVar2;
  Ref local_30;
  undefined1 local_28 [8];
  IString key_local;
  Ref obj_local;
  
  key_local.str._M_len = key.str._M_len;
  local_28 = (undefined1  [8])obj.inst;
  key_local.str._M_str = (char *)this;
  local_30 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_30);
  RVar2 = makeRawString((IString *)DOT);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  pVVar1 = cashew::Value::push_back(pVVar1,(Ref)key_local.str._M_str);
  RVar2 = makeRawString((IString *)local_28);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  Ref::Ref(&obj_local,pVVar1);
  return (Ref)obj_local.inst;
}

Assistant:

static Ref makeDot(Ref obj, IString key) {
    return &makeRawArray(3)
              ->push_back(makeRawString(DOT))
              .push_back(obj)
              .push_back(makeRawString(key));
  }